

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cord.cc
# Opt level: O1

void __thiscall absl::lts_20250127::Cord::Clear(Cord *this)

{
  RefcountAndFlags *pRVar1;
  uint uVar2;
  byte bVar3;
  CordRep *rep;
  CordzInfo *this_00;
  
  if (((this->contents_).data_.rep_.field_0.data[0] & 1U) != 0) {
    this_00 = cord_internal::InlineData::cordz_info((InlineData *)this);
    if (this_00 != (CordzInfo *)0x0) {
      cord_internal::CordzInfo::Untrack(this_00);
    }
  }
  bVar3 = (this->contents_).data_.rep_.field_0.data[0];
  rep = (this->contents_).data_.rep_.field_0.as_tree.rep;
  (this->contents_).data_.rep_.field_0.as_tree.cordz_info = 0;
  (this->contents_).data_.rep_.field_0.as_tree.rep = (CordRep *)0x0;
  if (rep != (CordRep *)0x0 && (bVar3 & 1) != 0) {
    LOCK();
    pRVar1 = &rep->refcount;
    uVar2 = (pRVar1->count_).super___atomic_base<int>._M_i;
    (pRVar1->count_).super___atomic_base<int>._M_i =
         (pRVar1->count_).super___atomic_base<int>._M_i + -2;
    UNLOCK();
    if ((uVar2 & 1) == 0 && (int)uVar2 < 1) {
      __assert_fail("refcount > 0 || refcount & kImmortalFlag",
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O1/_deps/absl-src/absl/strings/internal/cord_internal.h"
                    ,0xac,
                    "bool absl::cord_internal::RefcountAndFlags::DecrementExpectHighRefcount()");
    }
    if (uVar2 == 2) {
      cord_internal::CordRep::Destroy(rep);
      return;
    }
  }
  return;
}

Assistant:

void Cord::Clear() {
  if (CordRep* tree = contents_.clear()) {
    CordRep::Unref(tree);
  }
}